

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

MakefileGenerator * __thiscall MakefileGenerator::fileInfo(MakefileGenerator *this,QString file)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  QString *in_RDX;
  long in_FS_OFFSET;
  QFileInfo value;
  FileInfoCacheKey cacheKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (fileInfo(QString)::noInfo == '\0') {
    iVar4 = __cxa_guard_acquire(&fileInfo(QString)::noInfo);
    if (iVar4 != 0) {
      QFileInfo::QFileInfo((QFileInfo *)&fileInfo(QString)::noInfo);
      __cxa_atexit(QFileInfo::~QFileInfo,&fileInfo(QString)::noInfo,&__dso_handle);
      __cxa_guard_release(&fileInfo(QString)::noInfo);
    }
  }
  if (fileInfo::cache == (QHash<FileInfoCacheKey,_QFileInfo> *)0x0) {
    fileInfo::cache = (QHash<FileInfoCacheKey,_QFileInfo> *)operator_new(8);
    fileInfo::cache->d = (Data *)0x0;
    qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey,QFileInfo>>,&fileInfo::cache);
  }
  cacheKey.pwd.d.size = -0x5555555555555556;
  cacheKey.pwd.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  cacheKey.pwd.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  cacheKey.file.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  cacheKey.file.d.size = -0x5555555555555556;
  cacheKey.hash = 0xaaaaaaaaaaaaaaaa;
  cacheKey.file.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  FileInfoCacheKey::FileInfoCacheKey(&cacheKey,in_RDX);
  _value = 0xaaaaaaaaaaaaaaaa;
  QHash<FileInfoCacheKey,_QFileInfo>::value
            ((QHash<FileInfoCacheKey,_QFileInfo> *)&value,(FileInfoCacheKey *)fileInfo::cache,
             (QFileInfo *)&cacheKey);
  bVar2 = operator!=(&value,(QFileInfo *)&fileInfo(QString)::noInfo);
  if (bVar2) {
    QFileInfo::QFileInfo((QFileInfo *)this,&value);
  }
  else {
    (this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo = (_func_int **)0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)this,(QString *)in_RDX);
    cVar3 = QFileInfo::exists();
    if (cVar3 != '\0') {
      QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
                ((QHash<FileInfoCacheKey,QFileInfo> *)fileInfo::cache,&cacheKey,(QFileInfo *)this);
    }
  }
  QFileInfo::~QFileInfo(&value);
  FileInfoCacheKey::~FileInfoCacheKey(&cacheKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo
MakefileGenerator::fileInfo(QString file) const
{
    Q_CONSTINIT static QHash<FileInfoCacheKey, QFileInfo> *cache = nullptr;
    static QFileInfo noInfo = QFileInfo();
    if(!cache) {
        cache = new QHash<FileInfoCacheKey, QFileInfo>;
        qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey, QFileInfo> >, (void**)&cache);
    }
    FileInfoCacheKey cacheKey(file);
    QFileInfo value = cache->value(cacheKey, noInfo);
    if (value != noInfo)
        return value;

    QFileInfo fi(file);
    if (fi.exists())
        cache->insert(cacheKey, fi);
    return fi;
}